

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_address.cpp
# Opt level: O1

size_t miniros::network::getAddressSize(Type type)

{
  size_t sVar1;
  size_t sVar2;
  
  sVar2 = 0x1c;
  if (type != AddressIPv6) {
    sVar2 = 0;
  }
  sVar1 = 0x10;
  if (type != AddressIPv4) {
    sVar1 = sVar2;
  }
  return sVar1;
}

Assistant:

size_t getAddressSize(const NetAddress::Type type)
{
  switch (type) {
    case NetAddress::Type::AddressIPv4:
      return sizeof (sockaddr_in);
    case NetAddress::Type::AddressIPv6:
      return sizeof (sockaddr_in6);
    default:
      return 0;
  }
}